

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collision.cc
# Opt level: O3

Arbiter * apollonia::Collide(PolygonBody *pa,PolygonBody *pb)

{
  Vec2 VVar1;
  Vec2 VVar2;
  Vec2 VVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  Vec2 VVar6;
  size_t sVar7;
  pointer pVVar8;
  Arbiter *this;
  long lVar9;
  pointer pVVar10;
  uint uVar11;
  uint uVar12;
  PolygonBody *this_00;
  ulong uVar13;
  pointer pCVar14;
  Vec2 VVar15;
  Vec2 *pVVar16;
  ulong uVar17;
  size_t unaff_R12;
  Contact *contact;
  size_t sVar18;
  byte bVar19;
  Float FVar20;
  Float FVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  Vec2 VVar28;
  float fVar31;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar32;
  undefined1 auVar33 [16];
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  initializer_list<apollonia::Contact> __l;
  size_t ia;
  Vec2 normal;
  size_t ib;
  ContactList contacts;
  ContactList clipped_contacts;
  size_t local_138;
  Vec2 local_130;
  size_t local_128;
  vector<apollonia::Contact,_std::allocator<apollonia::Contact>_> local_120;
  undefined1 local_108 [16];
  ContactList local_f8;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  Contact local_c0;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined2 local_60;
  ulong local_58;
  ulong local_50;
  undefined8 local_44;
  undefined4 local_3c;
  
  bVar19 = 0;
  FVar20 = PolygonBody::FindMinSeparatingAxis(pa,&local_138,pb);
  if ((0.0 <= FVar20) ||
     (FVar21 = PolygonBody::FindMinSeparatingAxis(pb,&local_128,pa), sVar18 = local_138,
     0.0 <= FVar21)) {
    this = (Arbiter *)0x0;
  }
  else {
    this_00 = pa;
    if (FVar20 < FVar21) {
      local_138 = local_128;
      local_128 = sVar18;
      this_00 = pb;
      pb = pa;
    }
    VVar15 = PolygonBody::EdgeAt(this_00,local_138);
    fVar22 = VVar15.x;
    fVar27 = VVar15.y;
    auVar33._0_8_ = CONCAT44(fVar22,fVar27) ^ 0x8000000000000000;
    auVar33._8_4_ = fVar27;
    auVar33._12_4_ = fVar27;
    fVar22 = SQRT(fVar27 * fVar27 + fVar22 * fVar22);
    auVar30._4_4_ = fVar22;
    auVar30._0_4_ = fVar22;
    auVar30._8_4_ = fVar22;
    auVar30._12_4_ = fVar22;
    local_108 = divps(auVar33,auVar30);
    local_130 = local_108._0_8_;
    local_d8 = local_108._4_4_;
    sVar18 = 0;
    fVar22 = 3.4028235e+38;
    fStack_d4 = local_d8;
    fStack_d0 = local_d8;
    fStack_cc = local_d8;
    do {
      VVar15 = PolygonBody::EdgeAt(pb,sVar18);
      fVar27 = VVar15.x;
      fVar23 = VVar15.y;
      fVar32 = SQRT(fVar23 * fVar23 + fVar27 * fVar27);
      fVar27 = (fVar23 / fVar32) * (float)local_108._0_4_ - (fVar27 / fVar32) * local_d8;
      sVar7 = sVar18;
      if (fVar22 <= fVar27) {
        fVar27 = fVar22;
        sVar7 = unaff_R12;
      }
      unaff_R12 = sVar7;
      pVVar10 = (pb->vertices_).
                super__Vector_base<apollonia::Vec2,_std::allocator<apollonia::Vec2>_>._M_impl.
                super__Vector_impl_data._M_start;
      sVar18 = sVar18 + 1;
      local_58 = (long)(pb->vertices_).
                       super__Vector_base<apollonia::Vec2,_std::allocator<apollonia::Vec2>_>._M_impl
                       .super__Vector_impl_data._M_finish - (long)pVVar10 >> 3;
      fVar22 = fVar27;
    } while (sVar18 < local_58);
    local_58 = (unaff_R12 + 1) % local_58;
    local_c0.pn = 0.0;
    local_c0.pt = 0.0;
    local_c0.bias = 0.0;
    local_c0.ra.x = 0.0;
    local_c0.ra.y = 0.0;
    local_c0.rb.x = 0.0;
    local_c0.rb.y = 0.0;
    local_c0.from_a._M_elems[0] = false;
    local_c0.from_a._M_elems[1] = false;
    VVar15 = (pb->super_Body).centroid_;
    VVar1 = (pb->super_Body).position_;
    fVar24 = VVar1.x;
    fVar35 = VVar1.y;
    fVar25 = VVar15.x;
    fVar37 = pVVar10[unaff_R12].x - fVar25;
    fVar26 = VVar15.y;
    fVar38 = pVVar10[unaff_R12].y - fVar26;
    fVar22 = (pb->super_Body).rotation_.mat_._M_elems[1].y;
    fVar27 = (pb->super_Body).rotation_.mat_._M_elems[0].y;
    fVar23 = (pb->super_Body).rotation_.mat_._M_elems[1].x;
    fVar32 = (pb->super_Body).rotation_.mat_._M_elems[0].x;
    local_c0.position.y = fVar37 * fVar23 + fVar38 * fVar22 + fVar26 + fVar35;
    local_c0.position.x = fVar37 * fVar32 + fVar38 * fVar27 + fVar25 + fVar24;
    local_44 = 0;
    local_3c = 0;
    local_70 = 0;
    uStack_68 = 0;
    local_60 = 0;
    fVar37 = pVVar10[local_58].x - fVar25;
    fVar38 = pVVar10[local_58].y - fVar26;
    local_78 = CONCAT44(fVar37 * fVar23 + fVar38 * fVar22 + fVar26 + fVar35,
                        fVar37 * fVar32 + fVar38 * fVar27 + fVar25 + fVar24);
    __l._M_len = 2;
    __l._M_array = &local_c0;
    local_c0.indices._M_elems[0] = unaff_R12;
    local_c0.indices._M_elems[1] = unaff_R12;
    local_50 = local_58;
    std::vector<apollonia::Contact,_std::allocator<apollonia::Contact>_>::vector
              (&local_120,__l,(allocator_type *)&local_f8);
    std::vector<apollonia::Contact,_std::allocator<apollonia::Contact>_>::vector
              ((vector<apollonia::Contact,_std::allocator<apollonia::Contact>_> *)&local_c0,
               &local_120);
    pVVar10 = (this_00->vertices_).
              super__Vector_base<apollonia::Vec2,_std::allocator<apollonia::Vec2>_>._M_impl.
              super__Vector_impl_data._M_start;
    pVVar8 = (this_00->vertices_).
             super__Vector_base<apollonia::Vec2,_std::allocator<apollonia::Vec2>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((long)pVVar8 - (long)pVVar10 != 0) {
      uVar13 = (long)pVVar8 - (long)pVVar10 >> 3;
      this = (Arbiter *)0x0;
      uVar17 = 0;
      do {
        if (uVar17 != local_138) {
          uVar13 = (uVar17 + 1) % uVar13;
          fVar22 = (this_00->super_Body).centroid_.x;
          fVar27 = (this_00->super_Body).centroid_.y;
          fVar23 = (this_00->super_Body).position_.x;
          fVar32 = (this_00->super_Body).position_.y;
          fVar34 = pVVar10[uVar13].y - fVar27;
          fVar36 = pVVar10[uVar17].y - fVar27;
          fVar38 = pVVar10[uVar13].x - fVar22;
          fVar31 = pVVar10[uVar17].x - fVar22;
          fVar24 = (this_00->super_Body).rotation_.mat_._M_elems[1].y;
          fVar35 = (this_00->super_Body).rotation_.mat_._M_elems[1].x;
          fVar25 = (this_00->super_Body).rotation_.mat_._M_elems[0].y;
          fVar26 = (this_00->super_Body).rotation_.mat_._M_elems[0].x;
          fVar37 = fVar23 + fVar26 * fVar31 + fVar25 * fVar36 + fVar22;
          fVar31 = fVar32 + fVar35 * fVar31 + fVar24 * fVar36 + fVar27;
          fVar23 = (fVar23 + fVar26 * fVar38 + fVar25 * fVar34 + fVar22) - fVar37;
          fVar24 = (fVar32 + fVar35 * fVar38 + fVar24 * fVar34 + fVar27) - fVar31;
          fVar22 = SQRT(fVar23 * fVar23 + fVar24 * fVar24);
          fVar23 = fVar23 / fVar22;
          fVar24 = fVar24 / fVar22;
          fVar32 = (((local_120.
                      super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>.
                      _M_impl.super__Vector_impl_data._M_start)->position).x - fVar37) * fVar24 -
                   (((local_120.
                      super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>.
                      _M_impl.super__Vector_impl_data._M_start)->position).y - fVar31) * fVar23;
          fVar22 = local_120.
                   super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>.
                   _M_impl.super__Vector_impl_data._M_start[1].position.x;
          fVar27 = local_120.
                   super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>.
                   _M_impl.super__Vector_impl_data._M_start[1].position.y;
          uVar11 = 0;
          if (fVar32 <= 0.0) {
            pCVar14 = local_120.
                      super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            VVar15 = local_c0.position;
            for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
              *(Vec2 *)VVar15 = pCVar14->position;
              pCVar14 = (pointer)((long)pCVar14 + (ulong)bVar19 * -0x10 + 8);
              VVar15 = (Vec2)((Vec2 *)((long)VVar15 + 8) + (ulong)bVar19 * -2);
            }
            uVar11 = 1;
          }
          fVar22 = (fVar22 - fVar37) * fVar24 - fVar23 * (fVar27 - fVar31);
          uVar12 = uVar11;
          if (fVar22 <= 0.0) {
            uVar12 = uVar11 + 1;
            pCVar14 = local_120.
                      super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>.
                      _M_impl.super__Vector_impl_data._M_start + 1;
            pVVar16 = (Vec2 *)((ulong)(uVar11 * 0x48) + (long)local_c0.position);
            for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
              *pVVar16 = pCVar14->position;
              pCVar14 = (pointer)((long)pCVar14 + (ulong)bVar19 * -0x10 + 8);
              pVVar16 = pVVar16 + (ulong)bVar19 * -2 + 1;
            }
          }
          if (fVar32 * fVar22 < 0.0) {
            fVar27 = fVar32 - fVar22;
            auVar29._0_4_ =
                 fVar32 * local_120.
                          super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].position.x -
                 fVar22 * ((local_120.
                            super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>
                            ._M_impl.super__Vector_impl_data._M_start)->position).x;
            auVar29._4_4_ =
                 fVar32 * local_120.
                          super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].position.y -
                 fVar22 * ((local_120.
                            super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>
                            ._M_impl.super__Vector_impl_data._M_start)->position).y;
            auVar29._8_4_ = fVar32 * 0.0 - fVar22 * 0.0;
            auVar29._12_4_ = fVar32 * 0.0 - fVar22 * 0.0;
            auVar4._4_4_ = fVar27;
            auVar4._0_4_ = fVar27;
            auVar4._8_4_ = fVar27;
            auVar4._12_4_ = fVar27;
            auVar30 = divps(auVar29,auVar4);
            if ((NAN(auVar30._0_4_)) || (NAN(auVar30._4_4_))) {
              __assert_fail("!std::isnan(v.x) && !std::isnan(v.y)",
                            "/workspace/llm4binary/github/license_c_cmakelists/wgtdkp[P]apollonia/src/collision.cc"
                            ,0x28,
                            "size_t apollonia::Clip(Arbiter::ContactList &, const Arbiter::ContactList &, size_t, const Vec2 &, const Vec2 &)"
                           );
            }
            lVar9 = (ulong)(uVar12 * 8) * 9;
            *(long *)((long)local_c0.position + lVar9) = auVar30._0_8_;
            *(undefined1 *)((long)((long)local_c0.position + 0x18) + lVar9) = 1;
            *(ulong *)((long)((array<unsigned_long,_2UL> *)((long)local_c0.position + 0x20))->
                             _M_elems + lVar9) = uVar17;
            if (1 < uVar12) {
              __assert_fail("num_out <= 2",
                            "/workspace/llm4binary/github/license_c_cmakelists/wgtdkp[P]apollonia/src/collision.cc"
                            ,0x2f,
                            "size_t apollonia::Clip(Arbiter::ContactList &, const Arbiter::ContactList &, size_t, const Vec2 &, const Vec2 &)"
                           );
            }
            uVar12 = uVar12 + 1;
          }
          if (uVar12 < 2) goto LAB_00110b67;
          std::vector<apollonia::Contact,_std::allocator<apollonia::Contact>_>::operator=
                    (&local_120,
                     (vector<apollonia::Contact,_std::allocator<apollonia::Contact>_> *)&local_c0);
          pVVar10 = (this_00->vertices_).
                    super__Vector_base<apollonia::Vec2,_std::allocator<apollonia::Vec2>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pVVar8 = (this_00->vertices_).
                   super__Vector_base<apollonia::Vec2,_std::allocator<apollonia::Vec2>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        }
        uVar17 = uVar17 + 1;
        uVar13 = (long)pVVar8 - (long)pVVar10 >> 3;
      } while (uVar17 < uVar13);
    }
    fVar22 = (this_00->super_Body).centroid_.x;
    fVar27 = (this_00->super_Body).centroid_.y;
    fVar35 = pVVar10[local_138].x - fVar22;
    fVar24 = pVVar10[local_138].y - fVar27;
    fVar23 = (this_00->super_Body).rotation_.mat_._M_elems[1].y;
    fVar32 = (this_00->super_Body).rotation_.mat_._M_elems[1].x;
    local_108._0_4_ =
         (this_00->super_Body).rotation_.mat_._M_elems[0].x * fVar35 +
         (this_00->super_Body).rotation_.mat_._M_elems[0].y * fVar24 + fVar22 +
         (this_00->super_Body).position_.x;
    fVar22 = (this_00->super_Body).position_.y;
    local_f8.super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8.super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this = World::NewArbiter(&this_00->super_Body,&pb->super_Body,&local_130,&local_f8);
    VVar15 = local_c0.position;
    VVar1 = local_c0.ra;
    if (local_f8.super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f8.
                      super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_f8.
                            super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_f8.
                            super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      VVar15 = local_c0.position;
      VVar1 = local_c0.ra;
    }
    for (; VVar6 = local_c0.ra, bVar5 = VVar15 != local_c0.ra, local_c0.ra = VVar1, bVar5;
        VVar15 = (Vec2)((long)VVar15 + 0x48)) {
      fVar25 = (float)*(undefined8 *)VVar15;
      fVar26 = (float)((ulong)*(undefined8 *)VVar15 >> 0x20);
      fVar37 = (fVar25 - (float)local_108._0_4_) * local_130.x +
               (fVar26 - (fVar35 * fVar32 + fVar24 * fVar23 + fVar27 + fVar22)) * local_130.y;
      if (fVar37 <= 0.0) {
        *(float *)((long)VVar15 + 0x30) = fVar37;
        VVar1 = (this_00->super_Body).centroid_;
        VVar2 = (this_00->super_Body).position_;
        VVar28.x = fVar25 - (VVar2.x + VVar1.x);
        VVar28.y = fVar26 - (VVar2.y + VVar1.y);
        *(Vec2 *)((long)VVar15 + 8) = VVar28;
        VVar1 = (pb->super_Body).centroid_;
        VVar2 = (pb->super_Body).position_;
        VVar3.y = fVar26 - (VVar2.y + VVar1.y);
        VVar3.x = fVar25 - (VVar2.x + VVar1.x);
        *(Vec2 *)((long)VVar15 + 0x10) = VVar3;
        Arbiter::AddContact(this,(Contact *)VVar15);
      }
      VVar1 = local_c0.ra;
      local_c0.ra = VVar6;
    }
LAB_00110b67:
    if (local_c0.position != (Vec2)0x0) {
      operator_delete((void *)local_c0.position,(long)local_c0.rb - (long)local_c0.position);
    }
    if (local_120.super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_120.
                      super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_120.
                            super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_120.
                            super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return this;
}

Assistant:

Arbiter* Collide(PolygonBody* pa, PolygonBody* pb) {
  size_t ia, ib;
  Float sa, sb;
  if ((sa = pa->FindMinSeparatingAxis(ia, *pb)) >= 0) {
    return nullptr;
  }
  if ((sb = pb->FindMinSeparatingAxis(ib, *pa)) >= 0) {
    return nullptr;
  }
  if (sa < sb) {
    std::swap(sa, sb);
    std::swap(ia, ib);
    std::swap(pa, pb);
  }
  auto& a = *pa;
  auto& b = *pb;
  auto normal = a.EdgeAt(ia).Normal();
  auto idx = FindIncidentEdge(normal, b);
  auto next_idx = (idx + 1) % b.Count();
  Arbiter::ContactList contacts = {{b, idx}, {b, next_idx}};
  auto clipped_contacts = contacts;
  for (size_t i = 0; i < a.Count(); ++i) {
    if (i == ia) {
      continue;
    }
    auto v0 = a.LocalToWorld(a[i]);
    auto v1 = a.LocalToWorld(a[(i+1)%a.Count()]);
    auto num = Clip(clipped_contacts, contacts, i, v0, v1);
    if (num < 2) {
      return nullptr;
    }
    assert(num == 2);
    contacts = clipped_contacts;
  }

  auto va = a.LocalToWorld(a[ia]);
  auto arbiter = World::NewArbiter(a, b, normal);
  for (auto& contact : clipped_contacts) {
    auto sep = Dot(contact.position - va, normal);
    if (sep <= 0) {
      contact.separation = sep;
      contact.ra = contact.position - a.LocalToWorld(a.centroid());
      contact.rb = contact.position - b.LocalToWorld(b.centroid());
      arbiter->AddContact(contact);
    }
  }
  return arbiter;
}